

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cpp_generator.cc
# Opt level: O2

void __thiscall
t_cpp_generator::print_const_value
          (t_cpp_generator *this,ostream *out,string *name,t_type *type,t_const_value *value)

{
  long lVar1;
  string name_00;
  string name_01;
  string name_02;
  string name_03;
  string name_04;
  string name_05;
  char cVar2;
  __type _Var3;
  t_const_value *ptVar4;
  ostream *poVar5;
  ostream *poVar6;
  _Rb_tree_node_base *p_Var7;
  _Base_ptr p_Var8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar10;
  t_type *type_00;
  long *plVar11;
  t_const_value *value_00;
  pointer pptVar12;
  bool bVar13;
  undefined8 in_stack_fffffffffffffe78;
  undefined8 in_stack_fffffffffffffe80;
  undefined8 in_stack_fffffffffffffe88;
  t_const_value *ptVar14;
  undefined8 in_stack_fffffffffffffe90;
  string v2;
  string val_1;
  string local_110 [32];
  undefined1 local_f0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0 [32];
  string local_90 [32];
  string local_70 [32];
  string local_50 [32];
  
  ptVar4 = (t_const_value *)t_type::get_true_type(type);
  cVar2 = (**(code **)(*(long *)&(ptVar4->mapVal_)._M_t._M_impl + 0x28))(ptVar4);
  if (cVar2 == '\0') {
    cVar2 = (**(code **)(*(long *)&(ptVar4->mapVal_)._M_t._M_impl + 0x50))(ptVar4);
    if (cVar2 == '\0') {
      cVar2 = (**(code **)(*(long *)&(ptVar4->mapVal_)._M_t._M_impl + 0x58))(ptVar4);
      poVar5 = out;
      if ((cVar2 == '\0') &&
         (cVar2 = (**(code **)(*(long *)&(ptVar4->mapVal_)._M_t._M_impl + 0x60))(ptVar4),
         poVar5 = out, cVar2 == '\0')) {
        cVar2 = (**(code **)(*(long *)&(ptVar4->mapVal_)._M_t._M_impl + 0x80))(ptVar4);
        if (cVar2 == '\0') {
          cVar2 = (**(code **)(*(long *)&(ptVar4->mapVal_)._M_t._M_impl + 0x70))(ptVar4);
          if (cVar2 == '\0') {
            cVar2 = (**(code **)(*(long *)&(ptVar4->mapVal_)._M_t._M_impl + 0x78))(ptVar4);
            if (cVar2 == '\0') {
              pbVar9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       __cxa_allocate_exception(0x20);
              pbVar10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        (**(code **)(*(long *)&(ptVar4->mapVal_)._M_t._M_impl + 0x18))(ptVar4);
              std::operator+(pbVar9,"INVALID TYPE IN print_const_value: ",pbVar10);
              __cxa_throw(pbVar9,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
            }
            ptVar4 = *(t_const_value **)
                      &ptVar4[1].mapVal_._M_t._M_impl.super__Rb_tree_header._M_header;
            poVar5 = out;
            for (pptVar12 = (value->listVal_).
                            super__Vector_base<t_const_value_*,_std::allocator<t_const_value_*>_>.
                            _M_impl.super__Vector_impl_data._M_start;
                pptVar12 !=
                (value->listVal_).
                super__Vector_base<t_const_value_*,_std::allocator<t_const_value_*>_>._M_impl.
                super__Vector_impl_data._M_finish; pptVar12 = pptVar12 + 1) {
              std::__cxx11::string::string(local_90,(string *)name);
              name_05._M_string_length = (size_type)poVar5;
              name_05._M_dataplus._M_p = (pointer)in_stack_fffffffffffffe78;
              name_05.field_2._M_allocated_capacity = (size_type)ptVar4;
              name_05.field_2._8_8_ = name;
              render_const_value(&v2,this,out,name_05,type,ptVar4);
              std::__cxx11::string::~string(local_90);
              poVar6 = t_generator::indent((t_generator *)this,out);
              poVar6 = std::operator<<(poVar6,(string *)name);
              poVar6 = std::operator<<(poVar6,".insert(");
              poVar6 = std::operator<<(poVar6,(string *)&v2);
              poVar6 = std::operator<<(poVar6,");");
              std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
              std::__cxx11::string::~string((string *)&v2);
            }
          }
          else {
            ptVar4 = *(t_const_value **)
                      &ptVar4[1].mapVal_._M_t._M_impl.super__Rb_tree_header._M_header;
            poVar5 = out;
            for (pptVar12 = (value->listVal_).
                            super__Vector_base<t_const_value_*,_std::allocator<t_const_value_*>_>.
                            _M_impl.super__Vector_impl_data._M_start;
                pptVar12 !=
                (value->listVal_).
                super__Vector_base<t_const_value_*,_std::allocator<t_const_value_*>_>._M_impl.
                super__Vector_impl_data._M_finish; pptVar12 = pptVar12 + 1) {
              std::__cxx11::string::string(local_70,(string *)name);
              name_04._M_string_length = (size_type)poVar5;
              name_04._M_dataplus._M_p = (pointer)in_stack_fffffffffffffe78;
              name_04.field_2._M_allocated_capacity = (size_type)ptVar4;
              name_04.field_2._8_8_ = name;
              render_const_value(&v2,this,out,name_04,type,ptVar4);
              std::__cxx11::string::~string(local_70);
              poVar6 = t_generator::indent((t_generator *)this,out);
              poVar6 = std::operator<<(poVar6,(string *)name);
              poVar6 = std::operator<<(poVar6,".push_back(");
              poVar6 = std::operator<<(poVar6,(string *)&v2);
              poVar6 = std::operator<<(poVar6,");");
              std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
              std::__cxx11::string::~string((string *)&v2);
            }
          }
        }
        else {
          ptVar14 = *(t_const_value **)
                     &ptVar4[1].mapVal_._M_t._M_impl.super__Rb_tree_header._M_header;
          ptVar4 = (t_const_value *)
                   ptVar4[1].mapVal_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          p_Var8 = (value->mapVal_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          poVar5 = out;
          while ((_Rb_tree_header *)p_Var8 != &(value->mapVal_)._M_t._M_impl.super__Rb_tree_header)
          {
            std::__cxx11::string::string(local_50,(string *)name);
            name_02._M_string_length = (size_type)poVar5;
            name_02._M_dataplus._M_p = (pointer)in_stack_fffffffffffffe78;
            name_02.field_2._M_allocated_capacity = (size_type)ptVar14;
            name_02.field_2._8_8_ = in_stack_fffffffffffffe90;
            render_const_value(&v2,this,poVar5,name_02,type,ptVar14);
            std::__cxx11::string::~string(local_50);
            std::__cxx11::string::string(local_110,(string *)name);
            name_03._M_string_length = (size_type)poVar5;
            name_03._M_dataplus._M_p = (pointer)in_stack_fffffffffffffe78;
            name_03.field_2._M_allocated_capacity = (size_type)ptVar14;
            name_03.field_2._8_8_ = in_stack_fffffffffffffe90;
            poVar6 = poVar5;
            render_const_value(&val_1,this,poVar5,name_03,type,ptVar4);
            std::__cxx11::string::~string(local_110);
            poVar5 = t_generator::indent((t_generator *)this,poVar5);
            poVar5 = std::operator<<(poVar5,(string *)name);
            poVar5 = std::operator<<(poVar5,".insert(std::make_pair(");
            poVar5 = std::operator<<(poVar5,(string *)&v2);
            poVar5 = std::operator<<(poVar5,", ");
            poVar5 = std::operator<<(poVar5,(string *)&val_1);
            poVar5 = std::operator<<(poVar5,"));");
            std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
            std::__cxx11::string::~string((string *)&val_1);
            std::__cxx11::string::~string((string *)&v2);
            p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
            poVar5 = poVar6;
          }
        }
      }
      else {
        ptVar14 = ptVar4;
        for (p_Var7 = (value->mapVal_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var7 != &(value->mapVal_)._M_t._M_impl.super__Rb_tree_header;
            p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7)) {
          value_00 = (t_const_value *)0x0;
          bVar13 = false;
          poVar6 = poVar5;
          for (plVar11 = *(long **)&(ptVar4->identifierVal_).field_2;
              plVar11 != *(long **)((long)&(ptVar4->identifierVal_).field_2 + 8);
              plVar11 = plVar11 + 1) {
            lVar1 = *plVar11;
            std::__cxx11::string::string((string *)&v2,(string *)(*(long *)(p_Var7 + 1) + 0x48));
            _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)(lVar1 + 0x68),&v2);
            ptVar4 = ptVar14;
            std::__cxx11::string::~string((string *)&v2);
            if (_Var3) {
              value_00 = *(t_const_value **)(*plVar11 + 0x60);
              bVar13 = *(int *)(*plVar11 + 0x8c) != 0;
            }
            ptVar14 = ptVar4;
          }
          if (value_00 == (t_const_value *)0x0) {
            pbVar9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     __cxa_allocate_exception(0x20);
            pbVar10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (**(code **)(*(long *)&(ptVar14->mapVal_)._M_t._M_impl + 0x18))();
            std::operator+(&val_1,"type error: ",pbVar10);
            std::operator+(&v2,&val_1," has no field ");
            std::__cxx11::string::string
                      ((string *)(local_f0 + 0x20),(string *)(*(long *)(p_Var7 + 1) + 0x48));
            std::operator+(pbVar9,&v2,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (local_f0 + 0x20));
            __cxa_throw(pbVar9,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
          }
          type_00 = (t_type *)local_f0;
          std::__cxx11::string::string((string *)local_f0,(string *)name);
          name_01._M_string_length = (size_type)poVar6;
          name_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffffe78;
          name_01.field_2._M_allocated_capacity = (size_type)ptVar14;
          name_01.field_2._8_8_ = name;
          poVar5 = poVar6;
          render_const_value(&v2,this,poVar6,name_01,type_00,value_00);
          std::__cxx11::string::~string((string *)local_f0);
          ptVar4 = ptVar14;
          poVar6 = t_generator::indent((t_generator *)this,poVar6);
          ptVar14 = ptVar4;
          poVar6 = std::operator<<(poVar6,(string *)name);
          poVar6 = std::operator<<(poVar6,".");
          std::__cxx11::string::string((string *)&val_1,(string *)(*(long *)(p_Var7 + 1) + 0x48));
          poVar6 = std::operator<<(poVar6,(string *)&val_1);
          poVar6 = std::operator<<(poVar6," = ");
          poVar6 = std::operator<<(poVar6,(string *)&v2);
          poVar6 = std::operator<<(poVar6,";");
          std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
          std::__cxx11::string::~string((string *)&val_1);
          if (bVar13) {
            poVar6 = t_generator::indent((t_generator *)this,poVar5);
            poVar6 = std::operator<<(poVar6,(string *)name);
            poVar6 = std::operator<<(poVar6,".__isset.");
            std::__cxx11::string::string((string *)&val_1,(string *)(*(long *)(p_Var7 + 1) + 0x48));
            poVar6 = std::operator<<(poVar6,(string *)&val_1);
            poVar6 = std::operator<<(poVar6," = true;");
            std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
            std::__cxx11::string::~string((string *)&val_1);
          }
          std::__cxx11::string::~string((string *)&v2);
        }
      }
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      return;
    }
    poVar5 = t_generator::indent((t_generator *)this,out);
    poVar5 = std::operator<<(poVar5,(string *)name);
    poVar5 = std::operator<<(poVar5," = (");
    type_name_abi_cxx11_(&v2,this,(t_type *)ptVar4,false,false);
    poVar5 = std::operator<<(poVar5,(string *)&v2);
    poVar5 = std::operator<<(poVar5,")");
    t_const_value::get_integer(value);
    poVar5 = std::ostream::_M_insert<long>((long)poVar5);
    poVar5 = std::operator<<(poVar5,";");
    poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  }
  else {
    std::__cxx11::string::string((string *)(local_f0 + 0x40),(string *)name);
    name_00._M_string_length = in_stack_fffffffffffffe80;
    name_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffffe78;
    name_00.field_2._M_allocated_capacity = in_stack_fffffffffffffe88;
    name_00.field_2._8_8_ = in_stack_fffffffffffffe90;
    render_const_value(&v2,this,out,name_00,type,ptVar4);
    std::__cxx11::string::~string((string *)(local_f0 + 0x40));
    poVar5 = t_generator::indent((t_generator *)this,out);
    poVar5 = std::operator<<(poVar5,(string *)name);
    poVar5 = std::operator<<(poVar5," = ");
    poVar5 = std::operator<<(poVar5,(string *)&v2);
    poVar5 = std::operator<<(poVar5,";");
    poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  }
  std::__cxx11::string::~string((string *)&v2);
  return;
}

Assistant:

void t_cpp_generator::print_const_value(ostream& out,
                                        string name,
                                        t_type* type,
                                        t_const_value* value) {
  type = get_true_type(type);
  if (type->is_base_type()) {
    string v2 = render_const_value(out, name, type, value);
    indent(out) << name << " = " << v2 << ";" << endl << endl;
  } else if (type->is_enum()) {
    indent(out) << name << " = (" << type_name(type) << ")" << value->get_integer() << ";" << endl
                << endl;
  } else if (type->is_struct() || type->is_xception()) {
    const vector<t_field*>& fields = ((t_struct*)type)->get_members();
    vector<t_field*>::const_iterator f_iter;
    const map<t_const_value*, t_const_value*, t_const_value::value_compare>& val = value->get_map();
    map<t_const_value*, t_const_value*, t_const_value::value_compare>::const_iterator v_iter;
    bool is_nonrequired_field = false;
    for (v_iter = val.begin(); v_iter != val.end(); ++v_iter) {
      t_type* field_type = nullptr;
      is_nonrequired_field = false;
      for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
        if ((*f_iter)->get_name() == v_iter->first->get_string()) {
          field_type = (*f_iter)->get_type();
          is_nonrequired_field = (*f_iter)->get_req() != t_field::T_REQUIRED;
        }
      }
      if (field_type == nullptr) {
        throw "type error: " + type->get_name() + " has no field " + v_iter->first->get_string();
      }
      string val = render_const_value(out, name, field_type, v_iter->second);
      indent(out) << name << "." << v_iter->first->get_string() << " = " << val << ";" << endl;
      if (is_nonrequired_field) {
        indent(out) << name << ".__isset." << v_iter->first->get_string() << " = true;" << endl;
      }
    }
    out << endl;
  } else if (type->is_map()) {
    t_type* ktype = ((t_map*)type)->get_key_type();
    t_type* vtype = ((t_map*)type)->get_val_type();
    const map<t_const_value*, t_const_value*, t_const_value::value_compare>& val = value->get_map();
    map<t_const_value*, t_const_value*, t_const_value::value_compare>::const_iterator v_iter;
    for (v_iter = val.begin(); v_iter != val.end(); ++v_iter) {
      string key = render_const_value(out, name, ktype, v_iter->first);
      string val = render_const_value(out, name, vtype, v_iter->second);
      indent(out) << name << ".insert(std::make_pair(" << key << ", " << val << "));" << endl;
    }
    out << endl;
  } else if (type->is_list()) {
    t_type* etype = ((t_list*)type)->get_elem_type();
    const vector<t_const_value*>& val = value->get_list();
    vector<t_const_value*>::const_iterator v_iter;
    for (v_iter = val.begin(); v_iter != val.end(); ++v_iter) {
      string val = render_const_value(out, name, etype, *v_iter);
      indent(out) << name << ".push_back(" << val << ");" << endl;
    }
    out << endl;
  } else if (type->is_set()) {
    t_type* etype = ((t_set*)type)->get_elem_type();
    const vector<t_const_value*>& val = value->get_list();
    vector<t_const_value*>::const_iterator v_iter;
    for (v_iter = val.begin(); v_iter != val.end(); ++v_iter) {
      string val = render_const_value(out, name, etype, *v_iter);
      indent(out) << name << ".insert(" << val << ");" << endl;
    }
    out << endl;
  } else {
    throw "INVALID TYPE IN print_const_value: " + type->get_name();
  }
}